

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprIfFalse(Parse *pParse,Expr *pExpr,int dest,int jumpIfNull)

{
  byte bVar1;
  Vdbe *v;
  Expr *pExpr_00;
  int *piVar2;
  u8 uVar3;
  int iVar4;
  int in2;
  uint uVar5;
  Select *pSVar6;
  int iVar7;
  int regFree1;
  int regFree2;
  
  v = pParse->pVdbe;
  _regFree1 = 0;
  if (pExpr == (Expr *)0x0 || v == (Vdbe *)0x0) {
    return;
  }
  bVar1 = pExpr->op;
  if (0xc < bVar1 - 0x46) {
    if (bVar1 == 0x13) {
      sqlite3ExprIfTrue(pParse,pExpr->pLeft,dest,jumpIfNull);
      goto LAB_0023679d;
    }
    if (bVar1 == 0x94) goto switchD_002365c0_caseD_48;
    goto LAB_00236674;
  }
  iVar7 = (bVar1 + 1 ^ 1) - 1;
  switch((uint)bVar1) {
  case 0x46:
    uVar5 = sqlite3VdbeMakeLabel(v);
    sqlite3ExprIfTrue(pParse,pExpr->pLeft,uVar5,jumpIfNull ^ 0x10);
    pParse->iCacheLevel = pParse->iCacheLevel + 1;
    sqlite3ExprIfFalse(pParse,pExpr->pRight,dest,jumpIfNull);
    piVar2 = v->pParse->aLabel;
    if (piVar2 != (int *)0x0) {
      piVar2[(int)~uVar5] = v->nOp;
    }
    break;
  case 0x47:
    sqlite3ExprIfFalse(pParse,pExpr->pLeft,dest,jumpIfNull);
    pParse->iCacheLevel = pParse->iCacheLevel + 1;
    sqlite3ExprIfFalse(pParse,pExpr->pRight,dest,jumpIfNull);
    break;
  case 0x48:
switchD_002365c0_caseD_48:
    iVar7 = (bVar1 != 0x48) + 0x4d;
    jumpIfNull = 0x80;
  default:
    pExpr_00 = pExpr->pLeft;
    uVar3 = pExpr_00->op;
    if (uVar3 == 0x9d) {
      uVar3 = pExpr_00->op2;
    }
    if (uVar3 == 'w') {
      pSVar6 = (pExpr_00->x).pSelect;
LAB_00236628:
      if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar6->pEList)->pList->nExpr) {
LAB_00236674:
        iVar7 = exprAlwaysFalse(pExpr);
        if (iVar7 == 0) {
          iVar7 = exprAlwaysTrue(pExpr);
          if (iVar7 != 0) goto LAB_0023679d;
          iVar4 = sqlite3ExprCodeTemp(pParse,pExpr,&regFree1);
          uVar5 = (uint)(jumpIfNull != 0);
          iVar7 = 0x16;
        }
        else {
          iVar7 = 0xd;
          iVar4 = 0;
LAB_0023668a:
          uVar5 = 0;
        }
        sqlite3VdbeAddOp3(v,iVar7,iVar4,dest,uVar5);
        goto LAB_0023679d;
      }
    }
    else if (uVar3 == 0x9e) {
      pSVar6 = (Select *)&pExpr_00->x;
      goto LAB_00236628;
    }
    iVar4 = sqlite3ExprCodeTemp(pParse,pExpr_00,&regFree1);
    in2 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    codeCompare(pParse,pExpr->pLeft,pExpr->pRight,iVar7,iVar4,in2,dest,jumpIfNull);
    goto LAB_0023679d;
  case 0x49:
    exprCodeBetween(pParse,pExpr,dest,sqlite3ExprIfFalse,jumpIfNull);
    goto LAB_0023679d;
  case 0x4a:
    if (jumpIfNull == 0) {
      uVar5 = sqlite3VdbeMakeLabel(v);
      sqlite3ExprCodeIN(pParse,pExpr,dest,uVar5);
      piVar2 = v->pParse->aLabel;
      if (piVar2 != (int *)0x0) {
        piVar2[(int)~uVar5] = v->nOp;
      }
    }
    else {
      sqlite3ExprCodeIN(pParse,pExpr,dest,dest);
    }
    goto LAB_0023679d;
  case 0x4b:
  case 0x4c:
    iVar4 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    goto LAB_0023668a;
  }
  sqlite3ExprCachePop(pParse);
LAB_0023679d:
  sqlite3ReleaseTempReg(pParse,regFree1);
  sqlite3ReleaseTempReg(pParse,regFree2);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprIfFalse(Parse *pParse, Expr *pExpr, int dest, int jumpIfNull){
  Vdbe *v = pParse->pVdbe;
  int op = 0;
  int regFree1 = 0;
  int regFree2 = 0;
  int r1, r2;

  assert( jumpIfNull==SQLITE_JUMPIFNULL || jumpIfNull==0 );
  if( NEVER(v==0) ) return; /* Existence of VDBE checked by caller */
  if( pExpr==0 )    return;

  /* The value of pExpr->op and op are related as follows:
  **
  **       pExpr->op            op
  **       ---------          ----------
  **       TK_ISNULL          OP_NotNull
  **       TK_NOTNULL         OP_IsNull
  **       TK_NE              OP_Eq
  **       TK_EQ              OP_Ne
  **       TK_GT              OP_Le
  **       TK_LE              OP_Gt
  **       TK_GE              OP_Lt
  **       TK_LT              OP_Ge
  **
  ** For other values of pExpr->op, op is undefined and unused.
  ** The value of TK_ and OP_ constants are arranged such that we
  ** can compute the mapping above using the following expression.
  ** Assert()s verify that the computation is correct.
  */
  op = ((pExpr->op+(TK_ISNULL&1))^1)-(TK_ISNULL&1);

  /* Verify correct alignment of TK_ and OP_ constants
  */
  assert( pExpr->op!=TK_ISNULL || op==OP_NotNull );
  assert( pExpr->op!=TK_NOTNULL || op==OP_IsNull );
  assert( pExpr->op!=TK_NE || op==OP_Eq );
  assert( pExpr->op!=TK_EQ || op==OP_Ne );
  assert( pExpr->op!=TK_LT || op==OP_Ge );
  assert( pExpr->op!=TK_LE || op==OP_Gt );
  assert( pExpr->op!=TK_GT || op==OP_Le );
  assert( pExpr->op!=TK_GE || op==OP_Lt );

  switch( pExpr->op ){
    case TK_AND: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest, jumpIfNull);
      sqlite3ExprCachePush(pParse);
      sqlite3ExprIfFalse(pParse, pExpr->pRight, dest, jumpIfNull);
      sqlite3ExprCachePop(pParse);
      break;
    }
    case TK_OR: {
      int d2 = sqlite3VdbeMakeLabel(v);
      testcase( jumpIfNull==0 );
      sqlite3ExprIfTrue(pParse, pExpr->pLeft, d2, jumpIfNull^SQLITE_JUMPIFNULL);
      sqlite3ExprCachePush(pParse);
      sqlite3ExprIfFalse(pParse, pExpr->pRight, dest, jumpIfNull);
      sqlite3VdbeResolveLabel(v, d2);
      sqlite3ExprCachePop(pParse);
      break;
    }
    case TK_NOT: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest, jumpIfNull);
      break;
    }
    case TK_IS:
    case TK_ISNOT:
      testcase( pExpr->op==TK_IS );
      testcase( pExpr->op==TK_ISNOT );
      op = (pExpr->op==TK_IS) ? TK_NE : TK_EQ;
      jumpIfNull = SQLITE_NULLEQ;
      /* Fall thru */
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      if( sqlite3ExprIsVector(pExpr->pLeft) ) goto default_expr;
      testcase( jumpIfNull==0 );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, jumpIfNull);
      assert(TK_LT==OP_Lt); testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
      assert(TK_LE==OP_Le); testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
      assert(TK_GT==OP_Gt); testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
      assert(TK_GE==OP_Ge); testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
      assert(TK_EQ==OP_Eq); testcase(op==OP_Eq);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull!=SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull==SQLITE_NULLEQ);
      assert(TK_NE==OP_Ne); testcase(op==OP_Ne);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull!=SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull==SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      sqlite3VdbeAddOp2(v, op, r1, dest);
      testcase( op==TK_ISNULL );   VdbeCoverageIf(v, op==TK_ISNULL);
      testcase( op==TK_NOTNULL );  VdbeCoverageIf(v, op==TK_NOTNULL);
      testcase( regFree1==0 );
      break;
    }
    case TK_BETWEEN: {
      testcase( jumpIfNull==0 );
      exprCodeBetween(pParse, pExpr, dest, sqlite3ExprIfFalse, jumpIfNull);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_IN: {
      if( jumpIfNull ){
        sqlite3ExprCodeIN(pParse, pExpr, dest, dest);
      }else{
        int destIfNull = sqlite3VdbeMakeLabel(v);
        sqlite3ExprCodeIN(pParse, pExpr, dest, destIfNull);
        sqlite3VdbeResolveLabel(v, destIfNull);
      }
      break;
    }
#endif
    default: {
    default_expr: 
      if( exprAlwaysFalse(pExpr) ){
        sqlite3VdbeGoto(v, dest);
      }else if( exprAlwaysTrue(pExpr) ){
        /* no-op */
      }else{
        r1 = sqlite3ExprCodeTemp(pParse, pExpr, &regFree1);
        sqlite3VdbeAddOp3(v, OP_IfNot, r1, dest, jumpIfNull!=0);
        VdbeCoverage(v);
        testcase( regFree1==0 );
        testcase( jumpIfNull==0 );
      }
      break;
    }
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);
}